

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O3

FString V_GetColorStringByName(char *name)

{
  int iVar1;
  int iVar2;
  size_t __n;
  ulong uVar3;
  char *in_RSI;
  char *pcVar4;
  FString __s1;
  char *pcVar5;
  char *pcVar6;
  FMemLump rgbNames;
  int c [3];
  char *local_60;
  FMemLump local_58;
  FMemLump local_50;
  char *local_48;
  uint local_3c [3];
  
  local_48 = in_RSI;
  FMemLump::FMemLump(&local_58);
  iVar2 = FWadCollection::GetNumLumps(&Wads);
  if (iVar2 != 0) {
    iVar2 = FWadCollection::CheckNumForName(&Wads,"X11R6RGB",0);
    if (iVar2 == -1) {
      pcVar4 = "X11R6RGB lump not found\n";
LAB_005ad536:
      Printf(pcVar4);
    }
    else {
      FWadCollection::ReadLump((FWadCollection *)&local_50,0xaad1d0);
      FMemLump::operator=(&local_58,&local_50);
      FMemLump::~FMemLump(&local_50);
      iVar1 = *(int *)((long)local_58.Block.Chars + -0xc);
      iVar2 = FWadCollection::LumpLength(&Wads,iVar2);
      pcVar4 = (char *)0x0;
      if (iVar1 == 0) {
        local_58.Block.Chars = (FString)(FString)pcVar4;
      }
      __n = strlen(local_48);
      if (0 < iVar2) {
        pcVar6 = (char *)((long)local_58.Block.Chars + (long)iVar2);
        __s1 = local_58.Block.Chars;
        do {
          if (*__s1.Chars < '!') {
            do {
              pcVar5 = __s1.Chars + 1;
              if (pcVar6 <= pcVar5) break;
              __s1.Chars = pcVar5;
            } while (*pcVar5 < '!');
          }
          else {
            iVar2 = (int)pcVar4;
            if ((iVar2 != 0) || (*__s1.Chars != '!')) {
              if (iVar2 < 3) {
                uVar3 = strtoul(__s1.Chars,&local_60,10);
                local_3c[iVar2] = (uint)uVar3;
                if (local_60 != __s1.Chars) {
                  pcVar4 = (char *)(ulong)(iVar2 + 1);
                  pcVar5 = local_60;
                  goto LAB_005ad518;
                }
              }
              else {
                pcVar4 = __s1.Chars;
                local_60 = __s1.Chars;
                if (__s1.Chars < pcVar6) {
                  do {
                    pcVar5 = pcVar4;
                    local_60 = pcVar4;
                    if (*pcVar4 == '\n') break;
                    pcVar4 = pcVar4 + 1;
                    pcVar5 = pcVar4;
                    local_60 = pcVar4;
                  } while (pcVar4 < pcVar6);
                  for (; (__s1.Chars < pcVar4 && (pcVar5 = pcVar4, *pcVar4 < '!'));
                      pcVar4 = pcVar4 + -1) {
                    pcVar5 = __s1.Chars;
                  }
                  if (pcVar5 != __s1.Chars) {
                    pcVar5 = pcVar5 + 1;
                    pcVar4 = (char *)0x0;
                    local_60 = pcVar5;
                    if (((long)pcVar5 - (long)__s1.Chars != __n) ||
                       (iVar2 = strncasecmp(__s1.Chars,local_48,__n), iVar2 != 0))
                    goto LAB_005ad518;
                    FString::NullString.RefCount = FString::NullString.RefCount + 1;
                    name[0] = ',';
                    name[1] = 'P';
                    name[2] = -0x76;
                    name[3] = '\0';
                    name[4] = '\0';
                    name[5] = '\0';
                    name[6] = '\0';
                    name[7] = '\0';
                    FString::Format((FString *)name,"#%02x%02x%02x",(ulong)local_3c[0],
                                    (ulong)local_3c[1],(ulong)local_3c[2]);
                    goto LAB_005ad54e;
                  }
                }
              }
              pcVar4 = "X11R6RGB lump is corrupt\n";
              goto LAB_005ad536;
            }
            do {
              pcVar5 = __s1.Chars + 1;
              pcVar4 = (char *)0x0;
              if (pcVar6 <= pcVar5) break;
              __s1.Chars = pcVar5;
            } while (*pcVar5 != '\n');
          }
LAB_005ad518:
          __s1.Chars = pcVar5;
        } while (pcVar5 < pcVar6);
      }
    }
  }
  name[0] = ',';
  name[1] = 'P';
  name[2] = -0x76;
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
LAB_005ad54e:
  FMemLump::~FMemLump(&local_58);
  return (FString)name;
}

Assistant:

FString V_GetColorStringByName (const char *name)
{
	FMemLump rgbNames;
	char *rgbEnd;
	char *rgb, *endp;
	int rgblump;
	int c[3], step;
	size_t namelen;

	if (Wads.GetNumLumps()==0) return FString();

	rgblump = Wads.CheckNumForName ("X11R6RGB");
	if (rgblump == -1)
	{
		Printf ("X11R6RGB lump not found\n");
		return FString();
	}

	rgbNames = Wads.ReadLump (rgblump);
	rgb = (char *)rgbNames.GetMem();
	rgbEnd = rgb + Wads.LumpLength (rgblump);
	step = 0;
	namelen = strlen (name);

	while (rgb < rgbEnd)
	{
		// Skip white space
		if (*rgb <= ' ')
		{
			do
			{
				rgb++;
			} while (rgb < rgbEnd && *rgb <= ' ');
		}
		else if (step == 0 && *rgb == '!')
		{ // skip comment lines
			do
			{
				rgb++;
			} while (rgb < rgbEnd && *rgb != '\n');
		}
		else if (step < 3)
		{ // collect RGB values
			c[step++] = strtoul (rgb, &endp, 10);
			if (endp == rgb)
			{
				break;
			}
			rgb = endp;
		}
		else
		{ // Check color name
			endp = rgb;
			// Find the end of the line
			while (endp < rgbEnd && *endp != '\n')
				endp++;
			// Back up over any whitespace
			while (endp > rgb && *endp <= ' ')
				endp--;
			if (endp == rgb)
			{
				break;
			}
			size_t checklen = ++endp - rgb;
			if (checklen == namelen && strnicmp (rgb, name, checklen) == 0)
			{
				FString descr;
				descr.Format ("#%02x%02x%02x", c[0], c[1], c[2]);
				return descr;
			}
			rgb = endp;
			step = 0;
		}
	}
	if (rgb < rgbEnd)
	{
		Printf ("X11R6RGB lump is corrupt\n");
	}
	return FString();
}